

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

Ga2_Man_t * Ga2_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Ga2_Man_t *pGVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  undefined8 *puVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  int *piVar12;
  Rnm_Man_t *pRVar13;
  int iVar14;
  uint uVar15;
  abctime aVar16;
  timespec ts;
  timespec local_40;
  
  pGVar6 = (Ga2_Man_t *)calloc(1,0xe0);
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    aVar16 = -1;
  }
  else {
    aVar16 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pGVar6->timeStart = aVar16;
  pGVar6->fUseNewLine = 1;
  pGVar6->pGia = pGia;
  pGVar6->pPars = pPars;
  iVar4 = Ga2_ManMarkup(pGia,5,pPars->fUseSimple);
  pGVar6->nMarked = iVar4;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar8;
  pGVar6->vCnfs = pVVar7;
  puVar9 = (undefined8 *)malloc(0x10);
  *puVar9 = 0;
  puVar9[1] = 0;
  pVVar7->nSize = 1;
  *ppvVar8 = puVar9;
  puVar9 = (undefined8 *)malloc(0x10);
  *puVar9 = 0;
  puVar9[1] = 0;
  if (pVVar7->nCap == 1) {
    if (pVVar7->pArray == (void **)0x0) {
      ppvVar8 = (void **)malloc(0x80);
    }
    else {
      ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
    }
    pVVar7->pArray = ppvVar8;
    pVVar7->nCap = 0x10;
  }
  iVar4 = pVVar7->nSize;
  pVVar7->nSize = iVar4 + 1;
  pVVar7->pArray[iVar4] = puVar9;
  iVar4 = pGia->nObjs;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar14 = iVar4;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar14;
  if (iVar14 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar14 << 2);
  }
  pVVar10->pArray = piVar11;
  pVVar10->nSize = iVar4;
  if (piVar11 != (int *)0x0) {
    memset(piVar11,0xff,(long)iVar4 << 2);
  }
  pGVar6->vIds = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 0;
  pVVar10->nSize = 0;
  pVVar10->pArray = (int *)0x0;
  pGVar6->vProofIds = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar12 = (int *)malloc(4000);
  pVVar10->pArray = piVar12;
  pGVar6->vAbs = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar12 = (int *)malloc(4000);
  pVVar10->pArray = piVar12;
  pGVar6->vValues = pVVar10;
  pGVar2 = pGia->pObjs;
  pGVar3 = pGVar6->pGia->pObjs;
  if ((pGVar2 < pGVar3) || (pGVar3 + pGVar6->pGia->nObjs <= pGVar2)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar15 = (int)((long)pGVar2 - (long)pGVar3 >> 2) * -0x55555555;
  if (((int)uVar15 < 0) || (iVar4 <= (int)uVar15)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar11[uVar15 & 0x7fffffff] = 0;
  Vec_IntPush(pVVar10,0);
  Vec_IntPush(pGVar6->vAbs,0);
  pRVar13 = Rnm_ManStart(pGia);
  pGVar6->pRnm = pRVar13;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar8;
  pGVar6->vId2Lit = pVVar7;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(400);
  pVVar10->pArray = piVar11;
  pGVar6->vLits = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(400);
  pVVar10->pArray = piVar11;
  pGVar6->vIsopMem = pVVar10;
  Cnf_ReadMsops(&pGVar6->pSopSizes,&pGVar6->pSops);
  uVar15 = 0x3ffff;
  while( true ) {
    do {
      uVar1 = uVar15 + 1;
      uVar5 = uVar15 & 1;
      uVar15 = uVar1;
    } while (uVar5 != 0);
    if (uVar1 < 9) break;
    iVar4 = 5;
    while (uVar1 % (iVar4 - 2U) != 0) {
      uVar5 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar1 < uVar5) goto LAB_005f9046;
    }
  }
LAB_005f9046:
  pGVar6->nTable = uVar1;
  piVar11 = (int *)calloc((long)(int)(uVar1 * 6),4);
  pGVar6->pTable = piVar11;
  return pGVar6;
}

Assistant:

Ga2_Man_t * Ga2_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Ga2_Man_t * p;
    p = ABC_CALLOC( Ga2_Man_t, 1 );
    p->timeStart = Abc_Clock();
    p->fUseNewLine = 1;
    // user data
    p->pGia      = pGia;
    p->pPars     = pPars;
    // markings 
    p->nMarked   = Ga2_ManMarkup( pGia, 5, pPars->fUseSimple );
    p->vCnfs     = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    // abstraction
    p->vIds      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vProofIds = Vec_IntAlloc( 0 );
    p->vAbs      = Vec_IntAlloc( 1000 );
    p->vValues   = Vec_IntAlloc( 1000 );
    // add constant node to abstraction
    Ga2_ObjSetId( p, Gia_ManConst0(pGia), 0 );
    Vec_IntPush( p->vValues, 0 );
    Vec_IntPush( p->vAbs, 0 );
    // refinement
    p->pRnm      = Rnm_ManStart( pGia );
//    p->pRf2      = Rf2_ManStart( pGia );
    // SAT solver and variables
    p->vId2Lit   = Vec_PtrAlloc( 1000 );
    // temporaries
    p->vLits     = Vec_IntAlloc( 100 );
    p->vIsopMem  = Vec_IntAlloc( 100 );
    Cnf_ReadMsops( &p->pSopSizes, &p->pSops );
    // hash table
    p->nTable = Abc_PrimeCudd(1<<18);
    p->pTable = ABC_CALLOC( int, 6 * p->nTable ); 
    return p;
}